

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertToLHProcess.cpp
# Opt level: O1

void __thiscall
Assimp::MakeLeftHandedProcess::ProcessAnimation(MakeLeftHandedProcess *this,aiNodeAnim *pAnim)

{
  long lVar1;
  ulong uVar2;
  
  if (pAnim->mNumPositionKeys != 0) {
    lVar1 = 0x10;
    uVar2 = 0;
    do {
      *(uint *)((long)&pAnim->mPositionKeys->mTime + lVar1) =
           *(uint *)((long)&pAnim->mPositionKeys->mTime + lVar1) ^ 0x80000000;
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x18;
    } while (uVar2 < pAnim->mNumPositionKeys);
  }
  if (pAnim->mNumRotationKeys != 0) {
    lVar1 = 0;
    uVar2 = 0;
    do {
      *(uint *)((long)&(pAnim->mRotationKeys->mValue).x + lVar1) =
           *(uint *)((long)&(pAnim->mRotationKeys->mValue).x + lVar1) ^ 0x80000000;
      *(uint *)((long)&(pAnim->mRotationKeys->mValue).y + lVar1) =
           *(uint *)((long)&(pAnim->mRotationKeys->mValue).y + lVar1) ^ 0x80000000;
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x18;
    } while (uVar2 < pAnim->mNumRotationKeys);
  }
  return;
}

Assistant:

void MakeLeftHandedProcess::ProcessAnimation( aiNodeAnim* pAnim)
{
    // position keys
    for( unsigned int a = 0; a < pAnim->mNumPositionKeys; a++)
        pAnim->mPositionKeys[a].mValue.z *= -1.0f;

    // rotation keys
    for( unsigned int a = 0; a < pAnim->mNumRotationKeys; a++)
    {
        /* That's the safe version, but the float errors add up. So we try the short version instead
        aiMatrix3x3 rotmat = pAnim->mRotationKeys[a].mValue.GetMatrix();
        rotmat.a3 = -rotmat.a3; rotmat.b3 = -rotmat.b3;
        rotmat.c1 = -rotmat.c1; rotmat.c2 = -rotmat.c2;
        aiQuaternion rotquat( rotmat);
        pAnim->mRotationKeys[a].mValue = rotquat;
        */
        pAnim->mRotationKeys[a].mValue.x *= -1.0f;
        pAnim->mRotationKeys[a].mValue.y *= -1.0f;
    }
}